

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCACore.cpp
# Opt level: O0

Var __thiscall Js::SCACore::Deserializer::ReadValue(Deserializer *this)

{
  ScriptContext *scriptContext_00;
  Var pvVar1;
  void *unaff_retaddr;
  undefined1 local_90 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  ScriptContext *scriptContext;
  Var returnedValue;
  Deserializer *this_local;
  
  scriptContext_00 = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this);
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_90,scriptContext_00,
             (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
             true,false,false);
  ScriptContext::OnScriptStart(scriptContext_00,false,true);
  EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_90);
  pvVar1 = SCADeserializationEngine::Deserialize
                     (&this->m_streamReader,this->m_transferableVars,this->m_cTransferableVars);
  EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_90);
  return pvVar1;
}

Assistant:

Var Deserializer::ReadValue()
        {
            Var returnedValue = nullptr;
            ScriptContext *scriptContext = m_streamReader.GetScriptContext();
            BEGIN_JS_RUNTIME_CALL(scriptContext)
            {
                returnedValue = Js::SCADeserializationEngine::Deserialize(&m_streamReader, m_transferableVars, m_cTransferableVars);
            }
            END_JS_RUNTIME_CALL(scriptContext)
                return returnedValue;
        }